

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O3

int b_arshift(lua_State *L)

{
  lua_Unsigned lVar1;
  uint uVar2;
  lua_Integer lVar3;
  byte bVar4;
  uint uVar5;
  lua_Unsigned u;
  
  lVar1 = luaL_checkunsigned(L,1);
  lVar3 = luaL_checkinteger(L,2);
  uVar5 = (uint)lVar3;
  bVar4 = (byte)lVar3;
  if ((int)lVar1 < 0 && -1 < (int)uVar5) {
    u = ~(0xffffffffU >> (bVar4 & 0x1f)) | lVar1 >> (bVar4 & 0x1f);
    if (0x1f < uVar5) {
      u = 0xffffffff;
    }
  }
  else {
    uVar2 = -uVar5;
    if ((int)uVar5 < 1) {
      u = 0;
      if (uVar2 < 0x20) {
        u = lVar1 << ((byte)uVar2 & 0x1f);
      }
    }
    else {
      u = 0;
      if (0xffffffe0 < uVar2) {
        u = lVar1 >> (bVar4 & 0x1f);
      }
    }
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_arshift (lua_State *L) {
  b_uint r = luaL_checkunsigned(L, 1);
  int i = luaL_checkint(L, 2);
  if (i < 0 || !(r & ((b_uint)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(~(b_uint)0 >> i));  /* add signal bit */
    lua_pushunsigned(L, r);
    return 1;
  }
}